

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bfextu_32_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint address;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar1 = m68ki_read_imm_16();
    uVar2 = m68ki_get_ea_pcdi();
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar7 = uVar1 >> 6 & 0x1f;
    }
    else {
      uVar7 = m68ki_cpu.dar[uVar1 >> 6 & 7];
    }
    uVar5 = uVar1;
    if ((uVar1 & 0x20) != 0) {
      uVar5 = m68ki_cpu.dar[uVar1 & 7];
    }
    address = (int)uVar7 / 8 + uVar2 + -1 + (uint)((uVar7 & 0x80000007) < 0x80000001);
    uVar6 = uVar5 - 1 & 0x1f;
    uVar2 = m68ki_read_32_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
    sVar3 = (sbyte)(uVar7 & 7);
    uVar4 = uVar2 << sVar3;
    if (0x20 < (uVar7 & 7) + uVar6 + 1) {
      uVar2 = m68ki_read_8_fc(address + 4,m68ki_address_space | m68ki_cpu.s_flag);
      uVar4 = uVar4 | (uVar2 << sVar3) >> 8;
    }
    m68ki_cpu.n_flag = uVar4 >> 0x18;
    m68ki_cpu.not_z_flag = uVar4 >> (~(byte)uVar6 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x1c)) = m68ki_cpu.not_z_flag;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfextu_32_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint data;
		uint ea = EA_PCDI_8();


		if(BIT_B(word2))
		offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);
		data = MASK_OUT_ABOVE_32(data<<offset);

		if((offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  >>= (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		REG_D[(word2 >> 12) & 7] = data;

		return;
	}
	m68ki_exception_illegal();
}